

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

iterator __thiscall
nestl::impl::vector<int,nestl::allocator<int>>::
insert_value<nestl::has_exceptions::exception_ptr_error,int>
          (vector<int,nestl::allocator<int>> *this,exception_ptr_error *err,const_iterator pos,
          int *args)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  iterator piVar5;
  value_type_conflict *oldLocation;
  value_type_conflict *val;
  value_type_conflict *first;
  value_type_conflict *last;
  size_t offset;
  int *args_local;
  const_iterator pos_local;
  exception_ptr_error *err_local;
  vector<int,_nestl::allocator<int>_> *this_local;
  
  if (pos < *(const_iterator *)(this + 8)) {
    __assert_fail("pos >= m_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2bd,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int>]"
                 );
  }
  if (*(const_iterator *)(this + 0x10) < pos) {
    __assert_fail("pos <= m_finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2be,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int>]"
                 );
  }
  lVar1 = *(long *)(this + 8);
  sVar3 = vector<int,_nestl::allocator<int>_>::capacity((vector<int,_nestl::allocator<int>_> *)this)
  ;
  sVar4 = vector<int,_nestl::allocator<int>_>::size((vector<int,_nestl::allocator<int>_> *)this);
  if (sVar3 == sVar4) {
    sVar3 = vector<int,_nestl::allocator<int>_>::capacity
                      ((vector<int,_nestl::allocator<int>_> *)this);
    vector<int,_nestl::allocator<int>_>::grow<nestl::has_exceptions::exception_ptr_error>
              ((vector<int,_nestl::allocator<int>_> *)this,err,sVar3 + 1);
    bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (bVar2) {
      piVar5 = vector<int,_nestl::allocator<int>_>::end((vector<int,_nestl::allocator<int>_> *)this)
      ;
      return piVar5;
    }
  }
  sVar3 = vector<int,_nestl::allocator<int>_>::capacity((vector<int,_nestl::allocator<int>_> *)this)
  ;
  sVar4 = vector<int,_nestl::allocator<int>_>::size((vector<int,_nestl::allocator<int>_> *)this);
  if (sVar4 < sVar3) {
    oldLocation = *(value_type_conflict **)(this + 0x10);
    this_local = (vector<int,_nestl::allocator<int>_> *)
                 (*(long *)(this + 8) + ((long)pos - lVar1 >> 2) * 4);
    while( true ) {
      if ((vector<int,_nestl::allocator<int>_> *)oldLocation == this_local) {
        class_operations::construct<int,nestl::has_exceptions::exception_ptr_error,int>
                  (err,(int *)this_local,args);
        bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
        if (bVar2) {
          this_local = (vector<int,_nestl::allocator<int>_> *)
                       vector<int,_nestl::allocator<int>_>::end
                                 ((vector<int,_nestl::allocator<int>_> *)this);
        }
        else {
          *(long *)(this + 0x10) = *(long *)(this + 0x10) + 4;
        }
        return (iterator)this_local;
      }
      class_operations::construct<int,nestl::has_exceptions::exception_ptr_error,int&>
                (err,oldLocation,oldLocation + -1);
      bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
      if (bVar2) break;
      nestl::detail::destroy<int*>(oldLocation + -1,oldLocation);
      oldLocation = oldLocation + -1;
    }
    piVar5 = vector<int,_nestl::allocator<int>_>::end((vector<int,_nestl::allocator<int>_> *)this);
    return piVar5;
  }
  __assert_fail("capacity() > size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                ,0x2cb,
                "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int>]"
               );
}

Assistant:

typename vector<T, A>::iterator
vector<T, A>::insert_value(OperationError& err, const_iterator pos, Args&& ... args) NESTL_NOEXCEPT_SPEC
{
    assert(pos >= m_start);
    assert(pos <= m_finish);

    /// we should calculate offset before possible reallocation
    size_t offset = pos - m_start;

    if (capacity() == size())
    {
        grow(err, capacity() + 1);
        if (err)
        {
            return end();
        }
    }
    assert(capacity() > size());

    value_type* last = m_finish;
    value_type* first = m_start + offset;
    for (value_type* val = last; val != first; --val)
    {
        value_type* oldLocation = val - 1;
        nestl::class_operations::construct(err, val, *oldLocation);
        if (err)
        {
            return end();
        }
        nestl::detail::destroy(oldLocation, val);
    }


	nestl::class_operations::construct(err, first, std::forward<Args>(args) ...);
    if (err)
    {
        return end();
    }

    ++m_finish;
    return first;
}